

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

void Ssc_GiaSimRound(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  word *pwVar3;
  word *pwVar4;
  Gia_Obj_t *pGVar5;
  word *pwVar6;
  ulong uVar7;
  int nWords;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  uVar1 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  Ssc_GiaResetSimInfo(p);
  nWords = (int)uVar1;
  if (nWords != p->vSims->nSize / p->nObjs) {
    __assert_fail("nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0xfd,"void Ssc_GiaSimRound(Gia_Man_t *)");
  }
  uVar9 = 0;
  pwVar3 = Gia_ObjSim(p,0);
  uVar7 = 0;
  if (0 < nWords) {
    uVar7 = uVar1 & 0xffffffff;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pwVar3[uVar9] = 0;
  }
  pwVar3 = Gia_ObjSim(p,1);
  pwVar4 = Gia_ObjSimPi(p,0);
  for (iVar10 = 0; iVar8 = p->vCis->nSize, iVar10 < iVar8; iVar10 = iVar10 + 1) {
    pGVar5 = Gia_ManCi(p,iVar10);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar8 = p->vCis->nSize;
      break;
    }
    pwVar6 = Gia_ObjSimObj(p,pGVar5);
    if (pwVar3 != pwVar6) {
      __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                    ,0x105,"void Ssc_GiaSimRound(Gia_Man_t *)");
    }
    Ssc_SimDup(pwVar3,pwVar4,nWords,0);
    pwVar4 = pwVar4 + nWords;
    pwVar3 = pwVar3 + nWords;
  }
  pwVar3 = Gia_ObjSim(p,iVar8 + 1);
  iVar10 = 0;
  do {
    iVar8 = p->nObjs;
    if (iVar8 <= iVar10) {
LAB_005125fb:
      pwVar3 = Gia_ObjSim(p,(iVar8 - p->vCos->nSize) + p->nRegs);
      iVar10 = 0;
      while( true ) {
        if (p->vCos->nSize - p->nRegs <= iVar10) {
          return;
        }
        pGVar5 = Gia_ManCo(p,iVar10);
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        pwVar4 = Gia_ObjSimObj(p,pGVar5);
        if (pwVar3 != pwVar4) {
          __assert_fail("pSim == Gia_ObjSimObj( p, pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                        ,0x118,"void Ssc_GiaSimRound(Gia_Man_t *)");
        }
        Ssc_SimDup(pwVar3,pwVar3 + -(long)(int)((*(uint *)pGVar5 & 0x1fffffff) * nWords),nWords,
                   *(uint *)pGVar5 >> 0x1d & 1);
        iVar10 = iVar10 + 1;
        pwVar3 = pwVar3 + nWords;
      }
      return;
    }
    pGVar5 = Gia_ManObj(p,iVar10);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar8 = p->nObjs;
      goto LAB_005125fb;
    }
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      pwVar4 = Gia_ObjSim(p,iVar10);
      if (pwVar3 != pwVar4) {
        __assert_fail("pSim == Gia_ObjSim( p, i )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                      ,0x10e,"void Ssc_GiaSimRound(Gia_Man_t *)");
      }
      uVar1 = *(ulong *)pGVar5;
      uVar2 = (uint)(uVar1 >> 0x20);
      Ssc_SimAnd(pwVar3,pwVar3 + -(long)(int)(((uint)uVar1 & 0x1fffffff) * nWords),
                 pwVar3 + -(long)(int)((uVar2 & 0x1fffffff) * nWords),nWords,
                 (uint)(uVar1 >> 0x1d) & 1,uVar2 >> 0x1d & 1);
      pwVar3 = pwVar3 + nWords;
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void Ssc_GiaSimRound( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSim, * pSim0, * pSim1;
    int i, nWords = Gia_ObjSimWords(p);
    Ssc_GiaResetSimInfo( p );
    assert( nWords == Vec_WrdSize(p->vSims) / Gia_ManObjNum(p) );
    // constant node
    Ssc_SimConst( Gia_ObjSim(p, 0), nWords, 0 );
    // primary inputs
    pSim = Gia_ObjSim( p, 1 );
    pSim0 = Gia_ObjSimPi( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        Ssc_SimDup( pSim, pSim0, nWords, 0 );
        pSim += nWords;
        pSim0 += nWords;
    }
    // intermediate nodes
    pSim = Gia_ObjSim( p, 1+Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pSim == Gia_ObjSim( p, i ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        pSim1 = pSim - pObj->iDiff1 * nWords;
        Ssc_SimAnd( pSim, pSim0, pSim1, nWords, Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj) );
        pSim += nWords;
    }
    // primary outputs
    pSim = Gia_ObjSim( p, Gia_ManObjNum(p) - Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        assert( pSim == Gia_ObjSimObj( p, pObj ) );
        pSim0 = pSim - pObj->iDiff0 * nWords;
        Ssc_SimDup( pSim, pSim0, nWords, Gia_ObjFaninC0(pObj) );
//        Extra_PrintBinary( stdout, pSim, 64 ), printf( "\n" );
        pSim += nWords;
    }
}